

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

void vkt::ssbo::anon_unknown_15::generateWriteSrc
               (ostream *src,BufferLayout *bufferLayout,BufferBlock *block,int instanceNdx,
               BlockDataPtr *blockPtr,BufferVar *bufVar,SubTypeAccess *accessPath)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  DataType dataType;
  StructType *this;
  BufferVar *pBVar4;
  TypeComponentVector *accessPath_00;
  void *pvVar5;
  ostream *poVar6;
  BlockDataPtr *accessPath_01;
  int local_134;
  void *valuePtr;
  undefined1 local_120 [3];
  bool isMatrix;
  DataType basicType;
  string shaderName;
  BufferVarLayoutEntry *varLayout;
  undefined1 local_f0 [4];
  int varNdx;
  string apiName;
  int local_9c;
  int memberNdx;
  int numMembers;
  SubTypeAccess local_88;
  int local_58;
  int local_54;
  int elemNdx;
  int arraySize;
  VarType curType;
  BufferVar *bufVar_local;
  BlockDataPtr *blockPtr_local;
  int instanceNdx_local;
  BufferBlock *block_local;
  BufferLayout *bufferLayout_local;
  ostream *src_local;
  
  accessPath_01 = blockPtr;
  curType.m_data._8_8_ = bufVar;
  glu::SubTypeAccess::getType((VarType *)&elemNdx,accessPath);
  bVar2 = glu::VarType::isArrayType((VarType *)&elemNdx);
  if (bVar2) {
    iVar3 = glu::VarType::getArraySize((VarType *)&elemNdx);
    if (iVar3 == -1) {
      local_134 = BufferBlock::getLastUnsizedArraySize(block,instanceNdx);
    }
    else {
      local_134 = glu::VarType::getArraySize((VarType *)&elemNdx);
    }
    local_54 = local_134;
    for (local_58 = 0; uVar1 = curType.m_data._8_8_, local_58 < local_54; local_58 = local_58 + 1) {
      glu::SubTypeAccess::element(&local_88,accessPath,local_58);
      generateWriteSrc(src,bufferLayout,block,instanceNdx,blockPtr,(BufferVar *)uVar1,&local_88);
      glu::SubTypeAccess::~SubTypeAccess(&local_88);
    }
  }
  else {
    bVar2 = glu::VarType::isStructType((VarType *)&elemNdx);
    uVar1 = curType.m_data._8_8_;
    if (bVar2) {
      this = glu::VarType::getStructPtr((VarType *)&elemNdx);
      iVar3 = glu::StructType::getNumMembers(this);
      for (local_9c = 0; uVar1 = curType.m_data._8_8_, local_9c < iVar3; local_9c = local_9c + 1) {
        glu::SubTypeAccess::member
                  ((SubTypeAccess *)((long)&apiName.field_2 + 8),accessPath,local_9c);
        generateWriteSrc(src,bufferLayout,block,instanceNdx,blockPtr,(BufferVar *)uVar1,
                         (SubTypeAccess *)((long)&apiName.field_2 + 8));
        glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)((long)&apiName.field_2 + 8));
      }
    }
    else {
      pBVar4 = (BufferVar *)glu::SubTypeAccess::getPath(accessPath);
      ssbo::(anonymous_namespace)::getAPIName_abi_cxx11_
                ((string *)local_f0,(_anonymous_namespace_ *)block,(BufferBlock *)uVar1,pBVar4,
                 (TypeComponentVector *)accessPath_01);
      iVar3 = BufferLayout::getVariableIndex(bufferLayout,(string *)local_f0);
      shaderName.field_2._8_8_ =
           std::
           vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
           ::operator[](&bufferLayout->bufferVars,(long)iVar3);
      uVar1 = curType.m_data._8_8_;
      pBVar4 = (BufferVar *)glu::SubTypeAccess::getPath(accessPath);
      ssbo::(anonymous_namespace)::getShaderName_abi_cxx11_
                ((string *)local_120,(_anonymous_namespace_ *)block,
                 (BufferBlock *)(ulong)(uint)instanceNdx,(int)uVar1,pBVar4,
                 (TypeComponentVector *)bufVar);
      dataType = glu::VarType::getBasicType((VarType *)&elemNdx);
      bVar2 = glu::isDataTypeMatrix(dataType);
      uVar1 = shaderName.field_2._8_8_;
      pvVar5 = blockPtr->ptr;
      accessPath_00 = glu::SubTypeAccess::getPath(accessPath);
      iVar3 = computeOffset((BufferVarLayoutEntry *)uVar1,accessPath_00);
      pvVar5 = (void *)((long)pvVar5 + (long)iVar3);
      poVar6 = std::operator<<(src,"\t");
      poVar6 = std::operator<<(poVar6,(string *)local_120);
      std::operator<<(poVar6," = ");
      if (bVar2) {
        generateImmMatrixSrc
                  (src,dataType,*(int *)(shaderName.field_2._8_8_ + 0x34),
                   (bool)(*(byte *)(shaderName.field_2._8_8_ + 0x40) & 1),pvVar5);
      }
      else {
        generateImmScalarVectorSrc(src,dataType,pvVar5);
      }
      std::operator<<(src,";\n");
      std::__cxx11::string::~string((string *)local_120);
      std::__cxx11::string::~string((string *)local_f0);
    }
  }
  glu::VarType::~VarType((VarType *)&elemNdx);
  return;
}

Assistant:

void generateWriteSrc (
	std::ostream&				src,
	const BufferLayout&			bufferLayout,
	const BufferBlock&			block,
	int							instanceNdx,
	const BlockDataPtr&			blockPtr,
	const BufferVar&			bufVar,
	const glu::SubTypeAccess&	accessPath)
{
	const VarType curType = accessPath.getType();

	if (curType.isArrayType())
	{
		const int arraySize = curType.getArraySize() == VarType::UNSIZED_ARRAY ? block.getLastUnsizedArraySize(instanceNdx) : curType.getArraySize();

		for (int elemNdx = 0; elemNdx < arraySize; elemNdx++)
			generateWriteSrc(src, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.element(elemNdx));
	}
	else if (curType.isStructType())
	{
		const int numMembers = curType.getStructPtr()->getNumMembers();

		for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
			generateWriteSrc(src, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.member(memberNdx));
	}
	else
	{
		DE_ASSERT(curType.isBasicType());

		const string	apiName	= getAPIName(block, bufVar, accessPath.getPath());
		const int		varNdx	= bufferLayout.getVariableIndex(apiName);

		DE_ASSERT(varNdx >= 0);
		{
			const BufferVarLayoutEntry&	varLayout		= bufferLayout.bufferVars[varNdx];
			const string				shaderName		= getShaderName(block, instanceNdx, bufVar, accessPath.getPath());
			const glu::DataType			basicType		= curType.getBasicType();
			const bool					isMatrix		= glu::isDataTypeMatrix(basicType);
			const void*					valuePtr		= (const deUint8*)blockPtr.ptr + computeOffset(varLayout, accessPath.getPath());

			src << "\t" << shaderName << " = ";

			if (isMatrix)
				generateImmMatrixSrc(src, basicType, varLayout.matrixStride, varLayout.isRowMajor, valuePtr);
			else
				generateImmScalarVectorSrc(src, basicType, valuePtr);

			src << ";\n";
		}
	}
}